

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_2> __thiscall
tcu::reflect<double,2>(tcu *this,Vector<double,_2> *i,Vector<double,_2> *n)

{
  double dVar1;
  Vector<double,_2> VVar2;
  Vector<double,_2> local_30;
  
  dVar1 = dot<double,2>(n,i);
  operator*(dVar1 + dVar1,n);
  VVar2 = operator-(i,&local_30);
  return (Vector<double,_2>)VVar2.m_data;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}